

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

var __thiscall cs::runtime_type::parse_access(runtime_type *this,var *a,var *b)

{
  _Map_pointer ppaVar1;
  _Elt_pointer paVar2;
  proxy *ppVar3;
  size_type sVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *this_00;
  MappedConstReference<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>_> paVar6;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar7;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this_01;
  ulong uVar8;
  undefined4 extraout_var_03;
  undefined *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  numeric *pnVar11;
  numeric_integer nVar12;
  runtime_error *prVar13;
  any *in_RCX;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  bool bVar17;
  longdouble lVar18;
  const_iterator cVar19;
  anon_union_16_2_310e9938_for_data local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  any local_c8;
  any local_c0;
  ulong local_b8;
  undefined2 uStack_b0;
  ulong local_a0;
  ulong local_90;
  long local_88;
  long local_80;
  longdouble local_78;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *local_60;
  _Head_base<0UL,_cs_impl::any_&&,_false> local_58;
  _Head_base<0UL,_cs::numeric_&&,_false> local_50;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>::iterator,_bool>
  local_48;
  
  if (b->mDat == (proxy *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    iVar5 = (*b->mDat->data->_vptr_baseHolder[2])();
    puVar9 = (undefined *)CONCAT44(extraout_var,iVar5);
  }
  pcVar16 = *(char **)(puVar9 + 8);
  if ((pcVar16 != "St5dequeIN7cs_impl3anyESaIS1_EE") &&
     ((*pcVar16 == '*' || (iVar5 = strcmp(pcVar16,"St5dequeIN7cs_impl3anyESaIS1_EE"), iVar5 != 0))))
  {
    if (b->mDat == (proxy *)0x0) {
      puVar9 = &void::typeinfo;
    }
    else {
      iVar5 = (*b->mDat->data->_vptr_baseHolder[2])();
      puVar9 = (undefined *)CONCAT44(extraout_var_00,iVar5);
    }
    pcVar16 = *(char **)(puVar9 + 8);
    if ((pcVar16 ==
         "N5phmap13flat_hash_mapIN7cs_impl3anyES2_NS_4HashIS2_EENS_7EqualToIS2_EESaISt4pairIKS2_S2_EEEE"
        ) || ((*pcVar16 != '*' &&
              (iVar5 = strcmp(pcVar16,
                              "N5phmap13flat_hash_mapIN7cs_impl3anyES2_NS_4HashIS2_EENS_7EqualToIS2_EESaISt4pairIKS2_S2_EEEE"
                             ), iVar5 == 0)))) {
      this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                 *)cs_impl::any::
                   const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                             (b);
      cVar19 = phmap::priv::
               raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               ::find<cs_impl::any>(this_00,in_RCX);
      if (cVar19.inner_.ctrl_ == this_00->ctrl_ + this_00->capacity_) {
        local_60 = cs_impl::any::
                   val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                             (b);
        local_c8.mDat = in_RCX->mDat;
        if (local_c8.mDat != (proxy *)0x0) {
          (local_c8.mDat)->refcount = (local_c8.mDat)->refcount + 1;
        }
        copy((EVP_PKEY_CTX *)&local_c0,(EVP_PKEY_CTX *)&local_c8);
        local_50._M_head_impl = (numeric *)&local_e8;
        local_d8._M_local_buf[0] = '\x01';
        local_e8._int = 0;
        local_58._M_head_impl = &local_c0;
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
        ::EmplaceDecomposable::operator()
                  (&local_48,&local_60,&local_c0,(piecewise_construct_t *)&std::piecewise_construct,
                   (tuple<cs_impl::any_&&> *)&local_58,(tuple<cs::numeric_&&> *)&local_50);
        cs_impl::any::recycle(&local_c0);
        cs_impl::any::recycle(&local_c8);
      }
      paVar6 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
               ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                           *)this_00,in_RCX);
      goto LAB_00260e05;
    }
    if (b->mDat == (proxy *)0x0) {
      puVar9 = &void::typeinfo;
    }
    else {
      iVar5 = (*b->mDat->data->_vptr_baseHolder[2])();
      puVar9 = (undefined *)CONCAT44(extraout_var_02,iVar5);
    }
    pcVar16 = *(char **)(puVar9 + 8);
    if ((pcVar16 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
       ((*pcVar16 == '*' ||
        (iVar5 = strcmp(pcVar16,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar5 != 0)
        ))) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_e8._int = (numeric_integer)&local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"Access non-array or string object.","");
      runtime_error::runtime_error(prVar13,(string *)&local_e8);
      __cxa_throw(prVar13,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    if (in_RCX->mDat == (proxy *)0x0) {
      puVar9 = &void::typeinfo;
    }
    else {
      iVar5 = (*in_RCX->mDat->data->_vptr_baseHolder[2])();
      puVar9 = (undefined *)CONCAT44(extraout_var_03,iVar5);
    }
    pcVar16 = *(char **)(puVar9 + 8);
    if ((pcVar16 != "N2cs7numericE") &&
       ((*pcVar16 == '*' || (iVar5 = strcmp(pcVar16,"N2cs7numericE"), iVar5 != 0)))) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_e8._int = (numeric_integer)&local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"Index must be a numeric.","");
      runtime_error::runtime_error(prVar13,(string *)&local_e8);
      __cxa_throw(prVar13,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    pbVar10 = cs_impl::any::const_val<std::__cxx11::string>(b);
    pnVar11 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    if (pnVar11->type == true) {
      if ((pnVar11->data)._int < 0) {
LAB_00260eef:
        sVar4 = pbVar10->_M_string_length;
        pnVar11 = cs_impl::any::const_val<cs::numeric>(in_RCX);
        local_80 = (long)ROUND(*(longdouble *)&pnVar11->data);
        nVar12 = local_80;
        if (pnVar11->type != false) {
          nVar12 = (pnVar11->data)._int;
        }
        pcVar16 = (pbVar10->_M_dataplus)._M_p + nVar12 + sVar4;
        goto LAB_00260f43;
      }
    }
    else if (*(longdouble *)&pnVar11->data < (longdouble)0) goto LAB_00260eef;
    pnVar11 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    local_88 = (long)ROUND(*(longdouble *)&pnVar11->data);
    nVar12 = local_88;
    if (pnVar11->type != false) {
      nVar12 = (pnVar11->data)._int;
    }
    pcVar16 = (pbVar10->_M_dataplus)._M_p + nVar12;
LAB_00260f43:
    cs_impl::any::make_constant<char,char_const&>((any *)this,pcVar16);
    return (var)(proxy *)this;
  }
  if (in_RCX->mDat == (proxy *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    iVar5 = (*in_RCX->mDat->data->_vptr_baseHolder[2])();
    puVar9 = (undefined *)CONCAT44(extraout_var_01,iVar5);
  }
  pcVar16 = *(char **)(puVar9 + 8);
  if ((pcVar16 != "N2cs7numericE") &&
     ((*pcVar16 == '*' || (iVar5 = strcmp(pcVar16,"N2cs7numericE"), iVar5 != 0)))) {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_e8._int = (numeric_integer)&local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Index must be a numeric.","");
    runtime_error::runtime_error(prVar13,(string *)&local_e8);
    __cxa_throw(prVar13,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  pdVar7 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(b);
  pnVar11 = cs_impl::any::const_val<cs::numeric>(in_RCX);
  if (pnVar11->type == true) {
    if (-1 < (pnVar11->data)._int) goto LAB_00260b5f;
LAB_00260ba0:
    pnVar11 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    if (pnVar11->type == true) {
      local_b8 = -(pnVar11->data)._int;
      uStack_b0 = 0;
      lVar18 = (longdouble)(unkuint10)local_b8;
    }
    else {
      lVar18 = -*(longdouble *)&pnVar11->data;
    }
    ppaVar1 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    uVar15 = ((long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                    .super__Deque_impl_data._M_start._M_last -
              (long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                    .super__Deque_impl_data._M_start._M_cur >> 3) +
             ((long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                    .super__Deque_impl_data._M_finish._M_cur -
              (long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                    .super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)ppaVar1 -
                       (long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                             )._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(ppaVar1 == (_Map_pointer)0x0)) * 0x40;
    if (pnVar11->type == false) {
      local_90 = uVar15;
      if ((longdouble)(long)uVar15 +
          (longdouble)*(float *)(&DAT_002c8a18 + (ulong)((long)uVar15 < 0) * 4) < lVar18)
      goto LAB_00260d5e;
    }
    else {
      local_78._0_8_ = SUB108(lVar18,0);
      bVar17 = uVar15 < local_78._0_8_;
      local_78 = lVar18;
      if (bVar17) {
LAB_00260d5e:
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_e8._int = (numeric_integer)&local_d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Out of range.","");
        runtime_error::runtime_error(prVar13,(string *)&local_e8);
        __cxa_throw(prVar13,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
    }
    pnVar11 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    lVar14 = (long)ROUND(*(longdouble *)&pnVar11->data);
    if (pnVar11->type != false) {
      lVar14 = (pnVar11->data)._int;
    }
    uVar15 = lVar14 + uVar15;
  }
  else {
    if (*(longdouble *)&pnVar11->data < (longdouble)0) goto LAB_00260ba0;
LAB_00260b5f:
    pnVar11 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    local_a0 = (ulong)ROUND(*(longdouble *)&pnVar11->data);
    uVar15 = local_a0;
    if (pnVar11->type != false) {
      uVar15 = (pnVar11->data)._int;
    }
    ppaVar1 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if (((long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_start._M_last -
         (long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)ppaVar1 -
                  (long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppaVar1 == (_Map_pointer)0x0)) * 0x40 <= uVar15) {
      this_01 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(b);
      ppaVar1 = (this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      uVar8 = (ulong)((long)ppaVar1 -
                     (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3;
      lVar14 = ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
               ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_first >> 3);
      if ((((ppaVar1 != (_Map_pointer)0x0) - uVar8) * 0x40 + uVar15) - lVar14 != -1) {
        uVar8 = ~((ulong)(ppaVar1 != (_Map_pointer)0x0) << 6) + lVar14 + uVar8 * 0x40;
        do {
          local_d8._M_local_buf[0] = '\x01';
          local_e8._int = 0;
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs::numeric>
                    (this_01,(numeric *)&local_e8);
          uVar8 = uVar8 + 1;
        } while (uVar15 != uVar8);
      }
    }
  }
  paVar2 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  uVar8 = ((long)paVar2 -
           (long)(pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) + uVar15;
  if ((long)uVar8 < 0) {
    uVar15 = (long)uVar8 >> 6;
  }
  else {
    if (uVar8 < 0x40) {
      paVar6 = paVar2 + uVar15;
      goto LAB_00260e05;
    }
    uVar15 = uVar8 >> 6;
  }
  paVar6 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
           super__Deque_impl_data._M_start._M_node[uVar15] + uVar8 + uVar15 * -0x40;
LAB_00260e05:
  ppVar3 = paVar6->mDat;
  if (ppVar3 != (proxy *)0x0) {
    ppVar3->refcount = ppVar3->refcount + 1;
  }
  (this->literals).
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .ctrl_ = &ppVar3->is_rvalue;
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_access(const var &a, const var &b)
	{
		if (a.type() == typeid(array)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			const auto &carr = a.const_val<array>();
			std::size_t posit = 0;
			if (b.const_val<numeric>() >= 0) {
				posit = b.const_val<numeric>().as_integer();
				if (posit >= carr.size()) {
					auto &arr = a.val<array>();
					for (std::size_t i = posit - arr.size() + 1; i > 0; --i)
						arr.emplace_back(numeric(0));
				}
			}
			else {
				if (-b.const_val<numeric>() > carr.size())
					throw runtime_error("Out of range.");
				posit = carr.size() + b.const_val<numeric>().as_integer();
			}
			return carr[posit];
		}
		else if (a.type() == typeid(hash_map)) {
			const auto &cmap = a.const_val<hash_map>();
			if (cmap.count(b) == 0)
				a.val<hash_map>().emplace(copy(b), numeric(0));
			return cmap.at(b);
		}
		else if (a.type() == typeid(string)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			const auto &cstr = a.const_val<string>();
			if (b.const_val<numeric>() >= 0)
				return var::make_constant<char>(cstr[b.const_val<numeric>().as_integer()]);
			else
				return var::make_constant<char>(cstr[cstr.size() + b.const_val<numeric>().as_integer()]);
		}
		else
			throw runtime_error("Access non-array or string object.");
	}